

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O2

void ntru_scale(uint16_t *out,uint16_t *in,uint16_t scale,uint p,uint q)

{
  uint16_t uVar1;
  undefined6 in_register_00000012;
  ulong uVar2;
  
  for (uVar2 = 0; p != uVar2; uVar2 = uVar2 + 1) {
    uVar1 = reduce((uint)in[uVar2] * (int)CONCAT62(in_register_00000012,scale),(uint16_t)q,
                   SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x1000000000000)) / ZEXT416(q & 0xffff),0));
    out[uVar2] = uVar1;
  }
  return;
}

Assistant:

void ntru_scale(uint16_t *out, const uint16_t *in, uint16_t scale,
               unsigned p, unsigned q)
{
    SETUP;
    for (unsigned i = 0; i < p; i++)
        out[i] = REDUCE(in[i] * scale);
}